

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase298::run(TestCase298 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader brand_00;
  Reader brand_01;
  Reader brand_02;
  undefined1 auVar2 [16];
  int iVar3;
  size_t __n;
  bool bVar4;
  ArrayPtr<const_char> AVar5;
  ArrayPtr<const_char> AVar6;
  Schema schema;
  DebugExpression<bool> _kjCondition;
  SchemaLoader loader;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_288;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_280;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_278;
  ArrayPtr<const_char> local_270;
  char *local_260;
  ulong local_258;
  char local_250;
  Reader local_248;
  Reader local_218;
  ArrayPtr<const_char> local_1e0;
  SchemaLoader local_1d0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Schema local_e0;
  PointerReader local_d8;
  ArrayPtr<const_char> local_b0;
  LazyLoadCallback local_a0;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  void *local_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  byte local_68;
  Reader local_60;
  
  local_1e0.size_ = (size_t)local_1e0.ptr;
  local_278 = local_280;
  local_280 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x6bf168;
  Schema::getProto(&local_60,&local_280.value);
  local_78 = local_60._reader.dataSize;
  SStack_74 = local_60._reader.pointerCount;
  uStack_72 = local_60._reader._38_2_;
  iStack_70 = local_60._reader.nestingLimit;
  uStack_6c = local_60._reader._44_4_;
  local_88 = local_60._reader.data;
  pWStack_80 = local_60._reader.pointers;
  local_98 = local_60._reader.segment;
  pCStack_90 = local_60._reader.capTable;
  local_a0._vptr_LazyLoadCallback = (_func_int **)&PTR_load_006b8d58;
  local_68 = 0;
  SchemaLoader::SchemaLoader(&local_1d0,&local_a0);
  local_f8 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  uStack_f0 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  SchemaLoader::tryGet((SchemaLoader *)&local_248,(uint64_t)&local_1d0,brand,(Schema)0x4d2);
  auVar2 = (undefined1  [16])_local_280;
  if ((byte)local_248._reader.segment == 1) {
    local_278._4_4_ = local_248._reader.capTable._4_4_;
    local_278._0_4_ = local_248._reader.capTable._0_4_;
    local_280 = auVar2._0_8_;
  }
  local_280._0_1_ = (byte)local_248._reader.segment;
  local_270.size_ = (size_t)" == ";
  local_270.ptr = &kj::none;
  local_260 = &DAT_00000005;
  local_258 = CONCAT71(local_258._1_7_,(byte)local_248._reader.segment) ^ 1;
  if (((byte)local_248._reader.segment & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<capnp::Schema>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x12e,ERROR,
               "\"failed: expected \" \"loader.tryGet(1234) == kj::none\", _kjCondition",
               (char (*) [49])"failed: expected loader.tryGet(1234) == kj::none",
               (DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&> *)&local_280.value);
  }
  local_280._0_1_ = local_68 ^ 1;
  if ((local_68 == 1) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x130,ERROR,"\"failed: expected \" \"!(callback.isLoaded())\", _kjCondition",
               (char (*) [40])"failed: expected !(callback.isLoaded())",
               (DebugExpression<bool> *)&local_280.value);
  }
  local_128 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  uStack_130 = 0;
  uStack_120 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand_00._reader._40_8_ = 0x7fffffff;
  brand_00._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand_00._reader.data = (void *)auVar1._16_8_;
  brand_00._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand_00._reader.dataSize = auVar1._32_4_;
  brand_00._reader.pointerCount = auVar1._36_2_;
  brand_00._reader._38_2_ = auVar1._38_2_;
  local_288.value = SchemaLoader::get(&local_1d0,0xa0a8f314b80b63fd,brand_00,(Schema)0x6d3cd8);
  local_280._0_1_ = local_68;
  if ((local_68 == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x132,ERROR,"\"failed: expected \" \"callback.isLoaded()\", _kjCondition",
               (char (*) [37])"failed: expected callback.isLoaded()",
               (DebugExpression<bool> *)&local_280.value);
  }
  Schema::getProto(&local_248,&local_288.value);
  bVar4 = local_248._reader.pointerCount == 0;
  local_218._reader.data = local_248._reader.pointers;
  if (bVar4) {
    local_218._reader.data = (WirePointer *)0x0;
  }
  local_218._reader.pointers._0_4_ = 0x7fffffff;
  if (!bVar4) {
    local_218._reader.pointers._0_4_ = local_248._reader.nestingLimit;
  }
  local_218._reader.segment._0_4_ = 0;
  local_218._reader.segment._4_4_ = 0;
  local_218._reader.capTable._0_4_ = 0;
  local_218._reader.capTable._4_4_ = 0;
  if (!bVar4) {
    local_218._reader.segment._0_4_ = local_248._reader.segment._0_4_;
    local_218._reader.segment._4_4_ = local_248._reader.segment._4_4_;
    local_218._reader.capTable._0_4_ = local_248._reader.capTable._0_4_;
    local_218._reader.capTable._4_4_ = local_248._reader.capTable._4_4_;
  }
  AVar5 = (ArrayPtr<const_char>)
          PointerReader::getBlob<capnp::Text>((PointerReader *)&local_218,(void *)0x0,0);
  __n = AVar5.size_;
  local_1e0.ptr = schemas::s_a0a8f314b80b63fd + 0x48;
  Schema::getProto(&local_218,(Schema *)&local_1e0);
  bVar4 = local_218._reader.pointerCount == 0;
  local_d8.pointer =
       (WirePointer *)CONCAT44(local_218._reader.pointers._4_4_,(int)local_218._reader.pointers);
  if (bVar4) {
    local_d8.pointer = (WirePointer *)0x0;
  }
  local_d8.nestingLimit = 0x7fffffff;
  if (!bVar4) {
    local_d8.nestingLimit = local_218._reader.nestingLimit;
  }
  local_d8.segment._0_4_ = 0;
  local_d8.segment._4_4_ = 0;
  local_d8.capTable._0_4_ = 0;
  local_d8.capTable._4_4_ = 0;
  if (!bVar4) {
    local_d8.segment._0_4_ = local_218._reader.segment._0_4_;
    local_d8.segment._4_4_ = local_218._reader.segment._4_4_;
    local_d8.capTable._0_4_ = local_218._reader.capTable._0_4_;
    local_d8.capTable._4_4_ = local_218._reader.capTable._4_4_;
  }
  AVar6 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_d8,(void *)0x0,0);
  if (__n == AVar6.size_) {
    if (__n == 0) {
      local_250 = true;
    }
    else {
      iVar3 = bcmp(AVar5.ptr,AVar6.ptr,__n);
      local_250 = iVar3 == 0;
    }
  }
  else {
    local_250 = false;
  }
  local_260 = " == ";
  local_258 = 5;
  _local_280 = AVar5;
  local_270 = AVar6;
  if (((bool)local_250 == false) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto(&local_248,&local_288.value);
    bVar4 = local_248._reader.pointerCount == 0;
    local_218._reader.data = local_248._reader.pointers;
    if (bVar4) {
      local_218._reader.data = (WirePointer *)0x0;
    }
    local_218._reader.pointers._0_4_ = 0x7fffffff;
    if (!bVar4) {
      local_218._reader.pointers._0_4_ = local_248._reader.nestingLimit;
    }
    local_218._reader.segment._0_4_ = 0;
    local_218._reader.segment._4_4_ = 0;
    local_218._reader.capTable._0_4_ = 0;
    local_218._reader.capTable._4_4_ = 0;
    if (!bVar4) {
      local_218._reader.segment._0_4_ = local_248._reader.segment._0_4_;
      local_218._reader.segment._4_4_ = local_248._reader.segment._4_4_;
      local_218._reader.capTable._0_4_ = local_248._reader.capTable._0_4_;
      local_218._reader.capTable._4_4_ = local_248._reader.capTable._4_4_;
    }
    local_1e0 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)&local_218,(void *)0x0,0);
    local_e0.raw = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
    Schema::getProto(&local_218,&local_e0);
    bVar4 = local_218._reader.pointerCount == 0;
    local_d8.pointer =
         (WirePointer *)CONCAT44(local_218._reader.pointers._4_4_,(int)local_218._reader.pointers);
    if (bVar4) {
      local_d8.pointer = (WirePointer *)0x0;
    }
    local_d8.nestingLimit = 0x7fffffff;
    if (!bVar4) {
      local_d8.nestingLimit = local_218._reader.nestingLimit;
    }
    local_d8.segment._0_4_ = 0;
    local_d8.segment._4_4_ = 0;
    local_d8.capTable._0_4_ = 0;
    local_d8.capTable._4_4_ = 0;
    if (!bVar4) {
      local_d8.segment._0_4_ = local_218._reader.segment._0_4_;
      local_d8.segment._4_4_ = local_218._reader.segment._4_4_;
      local_d8.capTable._0_4_ = local_218._reader.capTable._0_4_;
      local_d8.capTable._4_4_ = local_218._reader.capTable._4_4_;
    }
    local_b0 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_d8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[116],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x135,ERROR,
               "\"failed: expected \" \"(schema.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())\", _kjCondition, schema.getProto().getDisplayName(), Schema::from<TestAllTypes>().getProto().getDisplayName()"
               ,(char (*) [116])
                "failed: expected (schema.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())"
               ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&local_280.value,
               (Reader *)&local_1e0,(Reader *)&local_b0);
  }
  local_278.value = Schema::getDependency(&local_288.value,0xa0a8f314b80b63fd,0);
  bVar4 = local_288 == local_278;
  local_270.ptr = " == ";
  local_270.size_ = (size_t)&DAT_00000005;
  local_280 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)&local_288;
  local_260._0_1_ = bVar4;
  if ((!bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_248._reader.segment =
         (SegmentReader *)Schema::getDependency(&local_288.value,0xa0a8f314b80b63fd,0);
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x137,ERROR,
               "\"failed: expected \" \"(schema) == (schema.getDependency(typeId<TestAllTypes>()))\", _kjCondition, schema, schema.getDependency(typeId<TestAllTypes>())"
               ,(char (*) [76])
                "failed: expected (schema) == (schema.getDependency(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&local_280.value,&local_288.value,
               (Schema *)&local_248);
  }
  local_158 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  uStack_150 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand_01._reader._40_8_ = 0x7fffffff;
  brand_01._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand_01._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand_01._reader.data = (void *)auVar1._16_8_;
  brand_01._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand_01._reader.dataSize = auVar1._32_4_;
  brand_01._reader.pointerCount = auVar1._36_2_;
  brand_01._reader._38_2_ = auVar1._38_2_;
  local_278.value = SchemaLoader::get(&local_1d0,0xa0a8f314b80b63fd,brand_01,(Schema)0x6d3cd8);
  local_280 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)&local_288;
  local_270.size_ = 5;
  local_270.ptr = " == ";
  local_260 = (char *)CONCAT71(local_260._1_7_,local_288 == local_278);
  if ((local_288 != local_278) && (kj::_::Debug::minSeverity < 3)) {
    local_188 = 0;
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_180 = 0x7fffffff;
    auVar1 = ZEXT1640(ZEXT816(0));
    brand_02._reader._40_8_ = 0x7fffffff;
    brand_02._reader.segment = (SegmentReader *)auVar1._0_8_;
    brand_02._reader.capTable = (CapTableReader *)auVar1._8_8_;
    brand_02._reader.data = (void *)auVar1._16_8_;
    brand_02._reader.pointers = (WirePointer *)auVar1._24_8_;
    brand_02._reader.dataSize = auVar1._32_4_;
    brand_02._reader.pointerCount = auVar1._36_2_;
    brand_02._reader._38_2_ = auVar1._38_2_;
    local_248._reader.segment =
         (SegmentReader *)SchemaLoader::get(&local_1d0,0xa0a8f314b80b63fd,brand_02,(Schema)0x6d3cd8)
    ;
    kj::_::Debug::
    log<char_const(&)[66],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x138,ERROR,
               "\"failed: expected \" \"(schema) == (loader.get(typeId<TestAllTypes>()))\", _kjCondition, schema, loader.get(typeId<TestAllTypes>())"
               ,(char (*) [66])"failed: expected (schema) == (loader.get(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&local_280.value,&local_288.value,
               (Schema *)&local_248);
  }
  SchemaLoader::~SchemaLoader(&local_1d0);
  return;
}

Assistant:

TEST(SchemaLoader, LazyLoad) {
  FakeLoaderCallback callback(Schema::from<TestAllTypes>().getProto());
  SchemaLoader loader(callback);

  EXPECT_TRUE(loader.tryGet(1234) == kj::none);

  EXPECT_FALSE(callback.isLoaded());
  Schema schema = loader.get(typeId<TestAllTypes>());
  EXPECT_TRUE(callback.isLoaded());

  EXPECT_EQ(schema.getProto().getDisplayName(),
            Schema::from<TestAllTypes>().getProto().getDisplayName());

  EXPECT_EQ(schema, schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_EQ(schema, loader.get(typeId<TestAllTypes>()));
}